

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintPair.hpp
# Opt level: O1

void __thiscall OpenMD::ConstraintPair::~ConstraintPair(ConstraintPair *this)

{
  ConstraintElem *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  pCVar1 = this->consElem1_;
  if (pCVar1 != (ConstraintElem *)0x0) {
    p_Var2 = (pCVar1->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pCVar1->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    operator_delete(pCVar1,0x28);
  }
  pCVar1 = this->consElem2_;
  if (pCVar1 != (ConstraintElem *)0x0) {
    p_Var2 = (pCVar1->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pCVar1->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    operator_delete(pCVar1,0x28);
    return;
  }
  return;
}

Assistant:

~ConstraintPair() {
      delete consElem1_;
      delete consElem2_;
    }